

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zel_events_checker.cpp
# Opt level: O1

void __thiscall
validation_layer::eventsChecker::ZEeventsChecker::checkForDeadlock
          (ZEeventsChecker *this,string *zeCallDisc,ze_event_handle_t hSignalEvent,
          uint32_t numWaitEvents,ze_event_handle_t *phWaitEvents)

{
  key_type __code;
  bool bVar1;
  mapped_type mVar2;
  uint uVar3;
  __node_base_ptr p_Var4;
  mapped_type *pmVar5;
  ostream *poVar6;
  mapped_type *this_00;
  _Hash_node_base *p_Var7;
  __node_base_ptr p_Var8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  _Hash_node_base *p_Var12;
  __node_base_ptr p_Var13;
  __node_base_ptr p_Var14;
  ze_event_handle_t *__k;
  ulong uVar15;
  uint32_t this_action_new_node_id;
  string spacePrefix;
  string fromAction;
  string toAction;
  vector<int,_std::allocator<int>_> dagIDsInPath;
  string action;
  pair<std::vector<int,_std::allocator<int>_>,_bool> path;
  ostringstream oss;
  key_type local_2c4;
  char *local_2c0;
  long local_2b8;
  undefined7 local_2b0;
  undefined4 uStack_2a9;
  undefined1 local_2a5;
  string *local_2a0;
  _Hash_node_base *local_298;
  _ze_event_handle_t *local_290;
  char *local_288;
  long local_280;
  undefined7 local_278;
  undefined4 uStack_271;
  undefined1 local_26d;
  _ze_event_handle_t *local_268;
  GraphCycles *local_260;
  ze_event_handle_t *local_258;
  char *local_250;
  long local_248;
  undefined7 local_240;
  undefined4 uStack_239;
  undefined1 local_235;
  vector<int,_std::allocator<int>_> local_230;
  char *local_218;
  long local_210;
  undefined7 local_208;
  undefined4 uStack_201;
  undefined1 local_1fd;
  ulong local_1f8;
  _Hashtable<_ze_event_handle_t_*,_std::pair<_ze_event_handle_t_*const,_unsigned_int>,_std::allocator<std::pair<_ze_event_handle_t_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<_ze_event_handle_t_*>,_std::hash<_ze_event_handle_t_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_1f0;
  long *local_1e8;
  long local_1e0;
  long local_1d8 [2];
  pair<std::vector<int,_std::allocator<int>_>,_bool> local_1c8;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  p_Var7 = (_Hash_node_base *)(ulong)numWaitEvents;
  local_2c4 = 0xffffffff;
  local_2a0 = zeCallDisc;
  local_290 = hSignalEvent;
  local_258 = phWaitEvents;
  if (hSignalEvent != (ze_event_handle_t)0x0) {
    uVar15 = (this->eventToDagID)._M_h._M_bucket_count;
    uVar9 = (ulong)hSignalEvent % uVar15;
    p_Var14 = (this->eventToDagID)._M_h._M_buckets[uVar9];
    p_Var8 = (__node_base_ptr)0x0;
    if ((p_Var14 != (__node_base_ptr)0x0) &&
       (p_Var12 = p_Var14->_M_nxt, p_Var8 = p_Var14,
       (ze_event_handle_t)p_Var14->_M_nxt[1]._M_nxt != hSignalEvent)) {
      while (p_Var14 = p_Var12, p_Var12 = p_Var14->_M_nxt, p_Var12 != (_Hash_node_base *)0x0) {
        p_Var8 = (__node_base_ptr)0x0;
        if (((ulong)p_Var12[1]._M_nxt % uVar15 != uVar9) ||
           (p_Var8 = p_Var14, (ze_event_handle_t)p_Var12[1]._M_nxt == hSignalEvent))
        goto LAB_001accbf;
      }
      p_Var8 = (__node_base_ptr)0x0;
    }
LAB_001accbf:
    if (p_Var8 == (__node_base_ptr)0x0) {
      p_Var12 = (_Hash_node_base *)0x0;
    }
    else {
      p_Var12 = p_Var8->_M_nxt;
    }
    if (p_Var12 == (_Hash_node_base *)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Warning: hSignalEvent {",0x17);
      poVar6 = std::ostream::_M_insert<void_const*>(&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,"} might be an invalid event in call to ",0x27);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,(local_2a0->_M_dataplus)._M_p,local_2a0->_M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
    }
    else {
      validateSignalEventOwnership(this,zeCallDisc,hSignalEvent);
      if (*(mapped_type *)&p_Var12[2]._M_nxt != 0xffffffff) {
        local_2c4 = *(mapped_type *)&p_Var12[2]._M_nxt;
      }
    }
    if (p_Var12 == (_Hash_node_base *)0x0) {
      return;
    }
  }
  if (numWaitEvents != 0) {
    uVar15 = (ulong)numWaitEvents;
    __k = local_258;
    do {
      p_Var4 = std::
               _Hashtable<_ze_event_handle_t_*,_std::pair<_ze_event_handle_t_*const,_unsigned_int>,_std::allocator<std::pair<_ze_event_handle_t_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<_ze_event_handle_t_*>,_std::hash<_ze_event_handle_t_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               ::_M_find_before_node
                         (&(this->eventToDagID)._M_h,
                          (ulong)*__k % (this->eventToDagID)._M_h._M_bucket_count,__k,
                          (__hash_code)*__k);
      if ((p_Var4 == (__node_base_ptr)0x0) || (p_Var4->_M_nxt == (_Hash_node_base *)0x0)) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Warning: phWaitEvents {",0x17);
        poVar6 = std::ostream::_M_insert<void_const*>(&std::cerr);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6,"} might be an invalid event in call to ",0x27);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,(local_2a0->_M_dataplus)._M_p,local_2a0->_M_string_length);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
        std::ostream::put((char)poVar6);
        std::ostream::flush();
        return;
      }
      __k = __k + 1;
      uVar15 = uVar15 - 1;
    } while (uVar15 != 0);
  }
  if (local_2c4 == 0xffffffff) {
    mVar2 = xla::GraphCycles::NewNode(&this->dag);
    local_2c4 = mVar2;
    pmVar5 = std::__detail::
             _Map_base<_ze_event_handle_t_*,_std::pair<_ze_event_handle_t_*const,_unsigned_int>,_std::allocator<std::pair<_ze_event_handle_t_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<_ze_event_handle_t_*>,_std::hash<_ze_event_handle_t_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<_ze_event_handle_t_*,_std::pair<_ze_event_handle_t_*const,_unsigned_int>,_std::allocator<std::pair<_ze_event_handle_t_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<_ze_event_handle_t_*>,_std::hash<_ze_event_handle_t_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&this->eventToDagID,&local_290);
    *pmVar5 = mVar2;
  }
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,(local_2a0->_M_dataplus)._M_p,local_2a0->_M_string_length
                     );
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,": (hSignalEvent{",0x10);
  poVar6 = std::ostream::_M_insert<void_const*>(poVar6);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"}, phWaitEvents{",0x10);
  local_298 = p_Var7;
  if (numWaitEvents != 0) {
    p_Var12 = (_Hash_node_base *)0x0;
    do {
      std::ostream::_M_insert<void_const*>((ostream *)local_1a8);
      if (p_Var12 < (_Hash_node_base *)(ulong)(numWaitEvents - 1)) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
      }
      p_Var12 = (_Hash_node_base *)((long)&p_Var12->_M_nxt + 1);
    } while (p_Var7 != p_Var12);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"})",2);
  p_Var7 = local_298;
  std::__cxx11::stringbuf::str();
  local_288 = (char *)&local_278;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_288,local_1e8,local_1e0 + (long)local_1e8);
  local_268 = local_290;
  this_00 = std::__detail::
            _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__ze_event_handle_t_*>_>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__ze_event_handle_t_*>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__ze_event_handle_t_*>_>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,__ze_event_handle_t_*>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)&this->dagIDToAction,&local_2c4);
  std::__cxx11::string::operator=((string *)this_00,(string *)&local_288);
  this_00->second = local_268;
  if (local_288 != (char *)&local_278) {
    operator_delete(local_288,CONCAT17((undefined1)uStack_271,local_278) + 1);
  }
  if ((int)p_Var7 != 0) {
    local_1f0 = &(this->eventToDagID)._M_h;
    local_260 = &this->dag;
    local_1f8 = (ulong)p_Var7 & 0xffffffff;
    uVar15 = 0;
    do {
      __code = local_258[uVar15];
      p_Var4 = std::
               _Hashtable<_ze_event_handle_t_*,_std::pair<_ze_event_handle_t_*const,_unsigned_int>,_std::allocator<std::pair<_ze_event_handle_t_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<_ze_event_handle_t_*>,_std::hash<_ze_event_handle_t_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               ::_M_find_before_node
                         (local_1f0,(ulong)__code % (this->eventToDagID)._M_h._M_bucket_count,
                          local_258 + uVar15,(__hash_code)__code);
      if (p_Var4 == (__node_base_ptr)0x0) {
        local_298 = (_Hash_node_base *)0x0;
      }
      else {
        local_298 = p_Var4->_M_nxt;
      }
      if (local_298 == (_Hash_node_base *)0x0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Warning: phWaitEvents {",0x17);
        poVar6 = std::ostream::_M_insert<void_const*>(&std::cerr);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6,"} might be an invalid event in call to ",0x27);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,(local_2a0->_M_dataplus)._M_p,local_2a0->_M_string_length);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
        std::ostream::put((char)poVar6);
        std::ostream::flush();
      }
      else {
        uVar3 = *(uint *)&local_298[2]._M_nxt;
        if (uVar3 == 0xffffffff) {
          uVar3 = xla::GraphCycles::NewNode(local_260);
          *(uint *)&local_298[2]._M_nxt = uVar3;
        }
        bVar1 = xla::GraphCycles::InsertEdge(local_260,uVar3,local_2c4);
        if (!bVar1) {
          uVar9 = (this->dagIDToAction)._M_h._M_bucket_count;
          uVar10 = (ulong)uVar3 % uVar9;
          p_Var14 = (this->dagIDToAction)._M_h._M_buckets[uVar10];
          p_Var8 = (__node_base_ptr)0x0;
          if ((p_Var14 != (__node_base_ptr)0x0) &&
             (p_Var8 = p_Var14, p_Var13 = p_Var14->_M_nxt,
             *(uint *)&p_Var14->_M_nxt[1]._M_nxt != uVar3)) {
            while (p_Var7 = p_Var13->_M_nxt, p_Var7 != (_Hash_node_base *)0x0) {
              p_Var8 = (__node_base_ptr)0x0;
              if (((ulong)*(uint *)&p_Var7[1]._M_nxt % uVar9 != uVar10) ||
                 (p_Var8 = p_Var13, p_Var13 = p_Var7, *(uint *)&p_Var7[1]._M_nxt == uVar3))
              goto LAB_001ad0d4;
            }
            p_Var8 = (__node_base_ptr)0x0;
          }
LAB_001ad0d4:
          if (p_Var8 == (__node_base_ptr)0x0) {
            p_Var7 = (_Hash_node_base *)0x0;
          }
          else {
            p_Var7 = p_Var8->_M_nxt;
          }
          local_288 = (char *)&local_278;
          if (p_Var7 == (_Hash_node_base *)0x0) {
            local_278 = 0x4f484543414c50;
            uStack_271 = 0x5245444c;
            local_280 = 0xb;
            local_26d = 0;
          }
          else {
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_288,p_Var7[2]._M_nxt,
                       (long)&(p_Var7[2]._M_nxt)->_M_nxt + (long)&(p_Var7[3]._M_nxt)->_M_nxt);
          }
          uVar9 = (this->dagIDToAction)._M_h._M_bucket_count;
          uVar10 = (ulong)local_2c4 % uVar9;
          p_Var14 = (this->dagIDToAction)._M_h._M_buckets[uVar10];
          p_Var8 = (__node_base_ptr)0x0;
          if ((p_Var14 != (__node_base_ptr)0x0) &&
             (p_Var8 = p_Var14, p_Var13 = p_Var14->_M_nxt,
             *(uint *)&p_Var14->_M_nxt[1]._M_nxt != local_2c4)) {
            while (p_Var7 = p_Var13->_M_nxt, p_Var7 != (_Hash_node_base *)0x0) {
              p_Var8 = (__node_base_ptr)0x0;
              if (((ulong)*(uint *)&p_Var7[1]._M_nxt % uVar9 != uVar10) ||
                 (p_Var8 = p_Var13, p_Var13 = p_Var7, *(uint *)&p_Var7[1]._M_nxt == local_2c4))
              goto LAB_001ad186;
            }
            p_Var8 = (__node_base_ptr)0x0;
          }
LAB_001ad186:
          if (p_Var8 == (__node_base_ptr)0x0) {
            p_Var7 = (_Hash_node_base *)0x0;
          }
          else {
            p_Var7 = p_Var8->_M_nxt;
          }
          if (p_Var7 == (_Hash_node_base *)0x0) {
            local_250 = (char *)&local_240;
            local_240 = 0x4f484543414c50;
            uStack_239 = 0x5245444c;
            local_248 = 0xb;
            local_235 = 0;
          }
          else {
            local_250 = (char *)&local_240;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_250,p_Var7[2]._M_nxt,
                       (long)&(p_Var7[2]._M_nxt)->_M_nxt + (long)&(p_Var7[3]._M_nxt)->_M_nxt);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Warning: There may be a potential event deadlock!\n",
                     0x32);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,
                     "Adding the following dependency would create a cycle in the DAG:\n\tFrom: ",
                     0x48);
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cerr,local_288,local_280);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n\tTo: ",6);
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_250,local_248);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"There is already a path:\n",0x19);
          xla::GraphCycles::PathDagIDs(&local_1c8,local_260,local_2c4,uVar3,0xf);
          std::vector<int,_std::allocator<int>_>::vector(&local_230,&local_1c8.first);
          uVar3 = *local_230.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          uVar9 = (this->dagIDToAction)._M_h._M_bucket_count;
          uVar10 = (ulong)uVar3 % uVar9;
          p_Var14 = (this->dagIDToAction)._M_h._M_buckets[uVar10];
          p_Var8 = (__node_base_ptr)0x0;
          if ((p_Var14 != (__node_base_ptr)0x0) &&
             (p_Var8 = p_Var14, p_Var13 = p_Var14->_M_nxt,
             *(uint *)&p_Var14->_M_nxt[1]._M_nxt != uVar3)) {
            while (p_Var7 = p_Var13->_M_nxt, p_Var7 != (_Hash_node_base *)0x0) {
              p_Var8 = (__node_base_ptr)0x0;
              if (((ulong)*(uint *)&p_Var7[1]._M_nxt % uVar9 != uVar10) ||
                 (p_Var8 = p_Var13, p_Var13 = p_Var7, *(uint *)&p_Var7[1]._M_nxt == uVar3))
              goto LAB_001ad323;
            }
            p_Var8 = (__node_base_ptr)0x0;
          }
LAB_001ad323:
          if (p_Var8 == (__node_base_ptr)0x0) {
            p_Var7 = (_Hash_node_base *)0x0;
          }
          else {
            p_Var7 = p_Var8->_M_nxt;
          }
          if (p_Var7 == (_Hash_node_base *)0x0) {
            local_2c0 = (char *)&local_2b0;
            local_2b0 = 0x4f484543414c50;
            uStack_2a9 = 0x5245444c;
            local_2b8 = 0xb;
            local_2a5 = 0;
          }
          else {
            local_2c0 = (char *)&local_2b0;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_2c0,p_Var7[2]._M_nxt,
                       (long)&(p_Var7[2]._M_nxt)->_M_nxt + (long)&(p_Var7[3]._M_nxt)->_M_nxt);
          }
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cerr,local_2c0,local_2b8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
          if (local_2c0 != (char *)&local_2b0) {
            operator_delete(local_2c0,CONCAT17((undefined1)uStack_2a9,local_2b0) + 1);
          }
          local_2c0 = (char *)&local_2b0;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c0,"");
          if (4 < (ulong)((long)local_230.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                         (long)local_230.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start)) {
            uVar9 = 1;
            do {
              poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)&std::cerr,local_2c0,local_2b8);
              std::__ostream_insert<char,std::char_traits<char>>(poVar6,"|\n",2);
              poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar6,local_2c0,local_2b8);
              std::__ostream_insert<char,std::char_traits<char>>(poVar6,"-> ",3);
              uVar3 = local_230.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar9];
              uVar10 = (this->dagIDToAction)._M_h._M_bucket_count;
              uVar11 = (ulong)uVar3 % uVar10;
              p_Var14 = (this->dagIDToAction)._M_h._M_buckets[uVar11];
              p_Var8 = (__node_base_ptr)0x0;
              if ((p_Var14 != (__node_base_ptr)0x0) &&
                 (p_Var8 = p_Var14, p_Var13 = p_Var14->_M_nxt,
                 *(uint *)&p_Var14->_M_nxt[1]._M_nxt != uVar3)) {
                while (p_Var7 = p_Var13->_M_nxt, p_Var7 != (_Hash_node_base *)0x0) {
                  p_Var8 = (__node_base_ptr)0x0;
                  if (((ulong)*(uint *)&p_Var7[1]._M_nxt % uVar10 != uVar11) ||
                     (p_Var8 = p_Var13, p_Var13 = p_Var7, *(uint *)&p_Var7[1]._M_nxt == uVar3))
                  goto LAB_001ad4c5;
                }
                p_Var8 = (__node_base_ptr)0x0;
              }
LAB_001ad4c5:
              if (p_Var8 == (__node_base_ptr)0x0) {
                p_Var7 = (_Hash_node_base *)0x0;
              }
              else {
                p_Var7 = p_Var8->_M_nxt;
              }
              local_218 = (char *)&local_208;
              if (p_Var7 == (_Hash_node_base *)0x0) {
                local_208 = 0x4f484543414c50;
                uStack_201 = 0x5245444c;
                local_210 = 0xb;
                local_1fd = 0;
              }
              else {
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_218,p_Var7[2]._M_nxt,
                           (long)&(p_Var7[2]._M_nxt)->_M_nxt + (long)&(p_Var7[3]._M_nxt)->_M_nxt);
              }
              poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar6,local_218,local_210);
              std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
              if (local_218 != (char *)&local_208) {
                operator_delete(local_218,CONCAT17((undefined1)uStack_201,local_208) + 1);
              }
              std::__cxx11::string::append((char *)&local_2c0);
              uVar9 = (ulong)((int)uVar9 + 1);
            } while (uVar9 < (ulong)((long)local_230.super__Vector_base<int,_std::allocator<int>_>.
                                           _M_impl.super__Vector_impl_data._M_finish -
                                     (long)local_230.super__Vector_base<int,_std::allocator<int>_>.
                                           _M_impl.super__Vector_impl_data._M_start >> 2));
          }
          if (local_1c8.second != false) {
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cerr,local_2c0,local_2b8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,"|\n",2);
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_2c0,local_2b8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,"-> ...\n",7);
          }
          if (local_2c0 != (char *)&local_2b0) {
            operator_delete(local_2c0,CONCAT17((undefined1)uStack_2a9,local_2b0) + 1);
          }
          if ((uint *)local_230.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start != (uint *)0x0) {
            operator_delete(local_230.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_230.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage -
                            (long)local_230.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          }
          if (local_1c8.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_1c8.first.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_1c8.first.super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_1c8.first.super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          if (local_250 != (char *)&local_240) {
            operator_delete(local_250,CONCAT17((undefined1)uStack_239,local_240) + 1);
          }
          if (local_288 != (char *)&local_278) {
            operator_delete(local_288,CONCAT17((undefined1)uStack_271,local_278) + 1);
          }
        }
      }
    } while ((local_298 != (_Hash_node_base *)0x0) && (uVar15 = uVar15 + 1, uVar15 != local_1f8));
  }
  if (local_1e8 != local_1d8) {
    operator_delete(local_1e8,local_1d8[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void eventsChecker::ZEeventsChecker::checkForDeadlock(
    const std::string &zeCallDisc,        /// action discription
    const ze_event_handle_t hSignalEvent, ///< [in][optional] handle of the event to forming the outgoing edge in the DAG
    const uint32_t numWaitEvents,         ///< [in][optional] number of events that point to this action.
    const ze_event_handle_t *phWaitEvents ///< [in][optional][range(0, numWaitEvents)] handle of the events that point to this action.
) {

    uint32_t this_action_new_node_id = invalidDagID;

    if (hSignalEvent != nullptr) {

        auto it = eventToDagID.find(hSignalEvent);
        // Check if user is using invalid events, hint if it doesn't exist in eventToDagID.
        if (it == eventToDagID.end()) {
            std::cerr << "Warning: hSignalEvent {" << hSignalEvent << "} might be an invalid event in call to " << zeCallDisc << std::endl;
            return;
        }

        // A passive check to see if the user is using the same event for multiple actions.
        // It only print warnings and does not stop the event deadlock checker.
        validateSignalEventOwnership(zeCallDisc, hSignalEvent);

        if (it->second != invalidDagID) {
            // This event already exists in the DAG. Get the DAG node ID.
            // For example when there is indeed a deadlock it would have already been created.
            this_action_new_node_id = it->second;
        }
    }

    for (uint32_t i = 0; i < numWaitEvents; i++) {
        if (eventToDagID.find(phWaitEvents[i]) == eventToDagID.end()) {
            std::cerr << "Warning: phWaitEvents {" << hSignalEvent << "} might be an invalid event in call to " << zeCallDisc << std::endl;
            return;
        }
    }

    if (this_action_new_node_id == invalidDagID) {
        // Create node in DAG
        this_action_new_node_id = addNodeInDag();

        // Now we know where the hSignalEvent points from/out in the DAG. Update the eventToDagID map.
        eventToDagID[hSignalEvent] = this_action_new_node_id;
    }

    // Add this action to the actionToDagID map.
    std::ostringstream oss;
    oss << zeCallDisc << ": (hSignalEvent{" << hSignalEvent << "}, phWaitEvents{";

    for (uint32_t i = 0; i < numWaitEvents; i++) {
        oss << phWaitEvents[i];
        if (i < numWaitEvents - 1) {
            oss << ", ";
        }
    }
    oss << "})";

    std::string action = oss.str(); // Convert the stream to a string.
    dagIDToAction[this_action_new_node_id] = actionAndSignalEvent(action, hSignalEvent);

    // Form the dependency in the DAG
    for (uint32_t i = 0; i < numWaitEvents; i++) {
        auto it = eventToDagID.find(phWaitEvents[i]);
        if (it == eventToDagID.end()) {
            std::cerr << "Warning: phWaitEvents {" << phWaitEvents[i] << "} might be an invalid event in call to " << zeCallDisc << std::endl;
            return;
        }
        uint32_t dagID = it->second;
        if (dagID == invalidDagID) {
            // Create a new node in the DAG for this wait event. That action will be created some time in the future.
            dagID = addNodeInDag();
            it->second = dagID;
        }

        auto getActionDetails = [&](int dagID) -> std::string {
            auto actionIt = dagIDToAction.find(dagID);
            return (actionIt != dagIDToAction.end()) ? actionIt->second.first : "PLACEHOLDER";
        };

        if (!addEdgeInDag(dagID, this_action_new_node_id)) {
            std::string fromAction = getActionDetails(dagID);
            std::string toAction = getActionDetails(this_action_new_node_id);

            std::cerr << "Warning: There may be a potential event deadlock!\n";
            std::cerr << "Adding the following dependency would create a cycle in the DAG:\n\tFrom: " << fromAction << "\n\tTo: " << toAction << "\n";
            std::cerr << "There is already a path:\n";

            constexpr uint32_t maxPathLength = 15;
            auto path = dag.PathDagIDs(this_action_new_node_id, dagID, maxPathLength);
            auto dagIDsInPath = path.first;
            std::cerr << getActionDetails(dagIDsInPath[0]) << "\n";
            std::string spacePrefix = "";
            for (uint32_t j = 1; j < dagIDsInPath.size(); j++) {
                std::cerr << spacePrefix << "|\n"
                          << spacePrefix << "-> " << getActionDetails(dagIDsInPath[j]) << "\n";
                spacePrefix += "   ";
            }
            if (path.second) {
                std::cerr << spacePrefix << "|\n"
                          << spacePrefix << "-> ...\n";
            }
        }
    }
}